

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O3

void tx_block_yrd(AV1_COMP *cpi,MACROBLOCK *x,int blk_row,int blk_col,int block,TX_SIZE tx_size,
                 BLOCK_SIZE plane_bsize,int depth,ENTROPY_CONTEXT *above_ctx,
                 ENTROPY_CONTEXT *left_ctx,TXFM_CONTEXT *tx_above,TXFM_CONTEXT *tx_left,
                 int64_t ref_best_rd,RD_STATS *rd_stats,FAST_TX_SEARCH_MODE ftxs_mode)

{
  uint8_t *puVar1;
  byte bVar2;
  TX_SIZE TVar3;
  BLOCK_SIZE BVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  MB_MODE_INFO *pMVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  TX_SIZE TVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  bool bVar27;
  FAST_TX_SEARCH_MODE in_stack_ffffffffffffff18;
  RD_STATS pn_rd_stats;
  TXB_CTX txb_ctx;
  
  uVar16 = (ulong)plane_bsize;
  uVar11 = (uint)block_size_high[uVar16];
  iVar12 = (x->e_mbd).mb_to_bottom_edge;
  if (iVar12 < 0) {
    uVar11 = (uint)block_size_high[uVar16] +
             (iVar12 >> ((char)(x->e_mbd).plane[0].subsampling_y + 3U & 0x1f));
  }
  uVar21 = (uint)block_size_wide[uVar16];
  iVar12 = (x->e_mbd).mb_to_right_edge;
  if (iVar12 < 0) {
    uVar21 = (uint)block_size_wide[uVar16] +
             (iVar12 >> ((char)(x->e_mbd).plane[0].subsampling_x + 3U & 0x1f));
  }
  iVar12 = ((int)uVar11 >> 2) - blk_row;
  if (iVar12 == 0 || (int)uVar11 >> 2 < blk_row) {
    return;
  }
  iVar22 = ((int)uVar21 >> 2) - blk_col;
  if (iVar22 == 0 || (int)uVar21 >> 2 < blk_col) {
    return;
  }
  lVar17 = (long)blk_col;
  lVar13 = (long)blk_row;
  uVar24 = (ulong)tx_size;
  bVar2 = *(byte *)((long)tx_size_wide + (ulong)((uint)tx_size * 4));
  uVar11 = (uint)*(byte *)((long)tx_size_high + (ulong)((uint)tx_size * 4));
  pMVar8 = *(x->e_mbd).mi;
  TVar3 = pMVar8->inter_tx_size
          [(blk_col >> (av1_get_txb_size_index_tw_w_log2_table[uVar16] & 0x1f)) +
           ((blk_row >> (av1_get_txb_size_index_tw_h_log2_table[uVar16] & 0x1f)) <<
           (av1_get_txb_size_index_stride_log2_table[uVar16] & 0x1f))];
  if (tx_size == '\0') {
    lVar26 = 0;
    goto LAB_0024fef9;
  }
  BVar4 = pMVar8->bsize;
  bVar5 = block_size_high[BVar4];
  if (block_size_high[BVar4] < block_size_wide[BVar4]) {
    bVar5 = block_size_wide[BVar4];
  }
  bVar10 = 1;
  uVar20 = 0x3f;
  if (bVar5 < 0x20) {
    if (bVar5 == 8) {
      TVar19 = '\x01';
      bVar10 = 0;
    }
    else {
      if (bVar5 != 0x10) goto LAB_0024fef3;
      TVar19 = '\x02';
    }
LAB_0024fece:
    uVar20 = (ulong)(byte)(((""[uVar24] != TVar19 & bVar10) + TVar19 * -2) * '\x03' + 0x18);
  }
  else {
    TVar19 = '\x04';
    if ((bVar5 == 0x80) || (bVar5 == 0x40)) goto LAB_0024fece;
    if (bVar5 == 0x20) {
      TVar19 = '\x03';
      goto LAB_0024fece;
    }
  }
LAB_0024fef3:
  lVar26 = (ulong)(tx_left[lVar13] < uVar11) + (ulong)(tx_above[lVar17] < bVar2) + uVar20;
LAB_0024fef9:
  iVar25 = 0;
  rd_stats->rate = 0;
  rd_stats->zero_rate = 0;
  rd_stats->dist = 0;
  rd_stats->rdcost = 0;
  rd_stats->sse = 0;
  rd_stats->skip_txfm = '\x01';
  if (TVar3 == tx_size) {
    bVar5 = ""[uVar24];
    bVar10 = ""[uVar24];
    get_txb_ctx(plane_bsize,tx_size,0,above_ctx + lVar17,left_ctx + lVar13,&txb_ctx);
    iVar12 = (x->coeff_costs).coeff_costs[(uint)bVar5 + (uint)bVar10 + 1 >> 1 & 0xff][0].
             txb_skip_cost[txb_ctx.txb_skip_ctx][1];
    rd_stats->zero_rate = iVar12;
    search_tx_type(cpi,x,0,block,blk_row,blk_col,plane_bsize,tx_size,&txb_ctx,'\0',0,ref_best_rd,
                   &pn_rd_stats);
    if (((long)rd_stats->rate == 0x7fffffff) || ((long)pn_rd_stats.rate == 0x7fffffff)) {
      rd_stats->rate = 0x7fffffff;
      rd_stats->zero_rate = 0;
      lVar23 = 0x7fffffffffffffff;
      rd_stats->dist = 0x7fffffffffffffff;
      rd_stats->rdcost = 0x7fffffffffffffff;
      rd_stats->sse = 0x7fffffffffffffff;
      lVar18 = 0x7fffffff;
      lVar14 = -0x80;
      bVar27 = false;
    }
    else {
      lVar18 = (long)pn_rd_stats.rate + (long)rd_stats->rate;
      if (0x7ffffffe < lVar18) {
        lVar18 = 0x7fffffff;
      }
      rd_stats->rate = (int)lVar18;
      if (rd_stats->zero_rate == 0) {
        rd_stats->zero_rate = pn_rd_stats.zero_rate;
      }
      lVar9 = rd_stats->sse;
      lVar14 = rd_stats->dist + pn_rd_stats.dist;
      rd_stats->dist = lVar14;
      lVar23 = 0x7fffffffffffffff;
      if ((lVar9 != 0x7fffffffffffffff) && (lVar23 = lVar9, pn_rd_stats.sse != 0x7fffffffffffffff))
      {
        rd_stats->sse = pn_rd_stats.sse + lVar9;
        lVar23 = pn_rd_stats.sse + lVar9;
      }
      lVar18 = (long)(int)lVar18;
      lVar14 = lVar14 * 0x80;
      bVar27 = (rd_stats->skip_txfm & pn_rd_stats.skip_txfm) == 1;
    }
    bVar5 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar16];
    if ((lVar23 * 0x80 + ((long)iVar12 * (long)x->rdmult + 0x100 >> 9) <=
         (lVar18 * x->rdmult + 0x100 >> 9) + lVar14) || (bVar27)) {
      rd_stats->rate = iVar12;
      rd_stats->dist = lVar23;
      rd_stats->skip_txfm = '\x01';
      puVar1 = (x->txfm_search_info).blk_skip + (int)((uint)bVar5 * blk_row + blk_col);
      *puVar1 = *puVar1 | 1;
      x->plane[0].eobs[block] = 0;
      x->plane[0].txb_entropy_ctx[block] = '\0';
      iVar12 = (x->e_mbd).tx_type_map_stride;
      (x->e_mbd).tx_type_map[blk_row * iVar12 + blk_col] = '\0';
      iVar22 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
      iVar25 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
      if (((0x41010UL >> (uVar24 & 0x3f) & 1) != 0) || ((0x20810UL >> (uVar24 & 0x3f) & 1) != 0)) {
        lVar23 = iVar12 * lVar13 + lVar17;
        lVar14 = 0;
        do {
          lVar18 = 0;
          do {
            (x->e_mbd).tx_type_map[lVar18 + lVar23] = '\0';
            lVar18 = lVar18 + 4;
          } while (lVar18 < iVar22);
          lVar14 = lVar14 + 4;
          lVar23 = lVar23 + (long)iVar12 * 4;
        } while (lVar14 < iVar25);
      }
    }
    else {
      rd_stats->skip_txfm = '\0';
      puVar1 = (x->txfm_search_info).blk_skip + (int)((uint)bVar5 * blk_row + blk_col);
      *puVar1 = *puVar1 & 0xfe;
    }
    if (depth < 2 && tx_size != '\0') {
      rd_stats->rate = rd_stats->rate + (x->mode_costs).txfm_partition_cost[lVar26][0];
    }
    uVar21 = (uint)x->plane[0].txb_entropy_ctx[block];
    memset(above_ctx + lVar17,uVar21,
           (long)*(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4)));
    memset(left_ctx + lVar13,uVar21,
           (long)*(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4)));
    bVar5 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
            [txsize_to_bsize[uVar24]];
    memset(tx_left + lVar13,uVar11,
           (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [txsize_to_bsize[uVar24]] +
                   (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [txsize_to_bsize[uVar24]] == 0) & 0xff));
    memset(tx_above + lVar17,(uint)bVar2,(ulong)((uint)bVar5 + (uint)(bVar5 == 0) & 0xff));
  }
  else {
    iVar6 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
    if (iVar6 < iVar12) {
      iVar12 = iVar6;
    }
    iVar6 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
    if (iVar6 < iVar22) {
      iVar22 = iVar6;
    }
    if (0 < iVar12) {
      bVar2 = ""[uVar24];
      iVar6 = tx_size_wide_unit[bVar2];
      iVar7 = tx_size_high_unit[bVar2];
      lVar13 = 0;
      iVar15 = 0;
      lVar17 = 0;
      do {
        if (0 < iVar22) {
          iVar25 = 0;
          do {
            pn_rd_stats.rate = 0;
            pn_rd_stats.dist = 0;
            pn_rd_stats.rdcost = 0;
            pn_rd_stats.sse = 0;
            pn_rd_stats.skip_txfm = '\x01';
            pn_rd_stats.zero_rate = 0;
            tx_block_yrd(cpi,x,blk_row + iVar15,blk_col + iVar25,block,bVar2,plane_bsize,depth + 1,
                         above_ctx,left_ctx,tx_above,tx_left,ref_best_rd - lVar17,&pn_rd_stats,
                         in_stack_ffffffffffffff18);
            lVar23 = (long)pn_rd_stats.rate;
            if (lVar23 == 0x7fffffff) {
              rd_stats->rate = 0x7fffffff;
              rd_stats->zero_rate = 0;
              rd_stats->dist = 0x7fffffffffffffff;
              rd_stats->rdcost = 0x7fffffffffffffff;
              rd_stats->sse = 0x7fffffffffffffff;
              rd_stats->skip_txfm = '\0';
              return;
            }
            if ((long)rd_stats->rate == 0x7fffffff) {
              rd_stats->dist = 0x7fffffffffffffff;
              rd_stats->rdcost = 0x7fffffffffffffff;
              rd_stats->sse = 0x7fffffffffffffff;
              rd_stats->skip_txfm = '\0';
              rd_stats->zero_rate = 0;
              lVar13 = 0x7fffffff;
            }
            else {
              lVar13 = rd_stats->rate + lVar23;
              if (0x7ffffffe < lVar13) {
                lVar13 = 0x7fffffff;
              }
              rd_stats->rate = (int)lVar13;
              if (rd_stats->zero_rate == 0) {
                rd_stats->zero_rate = pn_rd_stats.zero_rate;
              }
              rd_stats->dist = rd_stats->dist + pn_rd_stats.dist;
              if ((rd_stats->sse != 0x7fffffffffffffff) && (pn_rd_stats.sse != 0x7fffffffffffffff))
              {
                rd_stats->sse = pn_rd_stats.sse + rd_stats->sse;
              }
              rd_stats->skip_txfm = rd_stats->skip_txfm & pn_rd_stats.skip_txfm;
            }
            lVar17 = pn_rd_stats.dist * 0x80 + lVar17 + (lVar23 * x->rdmult + 0x100 >> 9);
            block = block + iVar7 * iVar6;
            iVar25 = iVar25 + iVar6;
          } while (iVar25 < iVar22);
        }
        iVar25 = (int)lVar13;
        iVar15 = iVar15 + iVar7;
      } while (iVar15 < iVar12);
    }
    if (depth < 2 && tx_size != '\0') {
      rd_stats->rate = iVar25 + (x->mode_costs).txfm_partition_cost[lVar26][1];
    }
  }
  return;
}

Assistant:

static inline void tx_block_yrd(const AV1_COMP *cpi, MACROBLOCK *x, int blk_row,
                                int blk_col, int block, TX_SIZE tx_size,
                                BLOCK_SIZE plane_bsize, int depth,
                                ENTROPY_CONTEXT *above_ctx,
                                ENTROPY_CONTEXT *left_ctx,
                                TXFM_CONTEXT *tx_above, TXFM_CONTEXT *tx_left,
                                int64_t ref_best_rd, RD_STATS *rd_stats,
                                FAST_TX_SEARCH_MODE ftxs_mode) {
  assert(tx_size < TX_SIZES_ALL);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(is_inter_block(mbmi));
  const int max_blocks_high = max_block_high(xd, plane_bsize, 0);
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, 0);

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  const TX_SIZE plane_tx_size = mbmi->inter_tx_size[av1_get_txb_size_index(
      plane_bsize, blk_row, blk_col)];
  const int ctx = txfm_partition_context(tx_above + blk_col, tx_left + blk_row,
                                         mbmi->bsize, tx_size);

  av1_init_rd_stats(rd_stats);
  if (tx_size == plane_tx_size) {
    ENTROPY_CONTEXT *ta = above_ctx + blk_col;
    ENTROPY_CONTEXT *tl = left_ctx + blk_row;
    const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
    TXB_CTX txb_ctx;
    get_txb_ctx(plane_bsize, tx_size, 0, ta, tl, &txb_ctx);

    const int zero_blk_rate =
        x->coeff_costs.coeff_costs[txs_ctx][get_plane_type(0)]
            .txb_skip_cost[txb_ctx.txb_skip_ctx][1];
    rd_stats->zero_rate = zero_blk_rate;
    tx_type_rd(cpi, x, tx_size, blk_row, blk_col, block, plane_bsize, &txb_ctx,
               rd_stats, ftxs_mode, ref_best_rd);
    const int mi_width = mi_size_wide[plane_bsize];
    TxfmSearchInfo *txfm_info = &x->txfm_search_info;
    if (RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist) >=
            RDCOST(x->rdmult, zero_blk_rate, rd_stats->sse) ||
        rd_stats->skip_txfm == 1) {
      rd_stats->rate = zero_blk_rate;
      rd_stats->dist = rd_stats->sse;
      rd_stats->skip_txfm = 1;
      set_blk_skip(txfm_info->blk_skip, 0, blk_row * mi_width + blk_col, 1);
      x->plane[0].eobs[block] = 0;
      x->plane[0].txb_entropy_ctx[block] = 0;
      update_txk_array(xd, blk_row, blk_col, tx_size, DCT_DCT);
    } else {
      rd_stats->skip_txfm = 0;
      set_blk_skip(txfm_info->blk_skip, 0, blk_row * mi_width + blk_col, 0);
    }
    if (tx_size > TX_4X4 && depth < MAX_VARTX_DEPTH)
      rd_stats->rate += x->mode_costs.txfm_partition_cost[ctx][0];
    av1_set_txb_context(x, 0, block, tx_size, ta, tl);
    txfm_partition_update(tx_above + blk_col, tx_left + blk_row, tx_size,
                          tx_size);
  } else {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int txb_width = tx_size_wide_unit[sub_txs];
    const int txb_height = tx_size_high_unit[sub_txs];
    const int step = txb_height * txb_width;
    const int row_end =
        AOMMIN(tx_size_high_unit[tx_size], max_blocks_high - blk_row);
    const int col_end =
        AOMMIN(tx_size_wide_unit[tx_size], max_blocks_wide - blk_col);
    RD_STATS pn_rd_stats;
    int64_t this_rd = 0;
    assert(txb_width > 0 && txb_height > 0);

    for (int row = 0; row < row_end; row += txb_height) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < col_end; col += txb_width) {
        const int offsetc = blk_col + col;

        av1_init_rd_stats(&pn_rd_stats);
        tx_block_yrd(cpi, x, offsetr, offsetc, block, sub_txs, plane_bsize,
                     depth + 1, above_ctx, left_ctx, tx_above, tx_left,
                     ref_best_rd - this_rd, &pn_rd_stats, ftxs_mode);
        if (pn_rd_stats.rate == INT_MAX) {
          av1_invalid_rd_stats(rd_stats);
          return;
        }
        av1_merge_rd_stats(rd_stats, &pn_rd_stats);
        this_rd += RDCOST(x->rdmult, pn_rd_stats.rate, pn_rd_stats.dist);
        block += step;
      }
    }

    if (tx_size > TX_4X4 && depth < MAX_VARTX_DEPTH)
      rd_stats->rate += x->mode_costs.txfm_partition_cost[ctx][1];
  }
}